

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

ssize_t __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::read
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *pCVar1;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *extraout_RAX;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  pCVar1 = this;
  if (this->P != (unsigned_long *)0x0) {
    pCVar1 = (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)
             ((long)this->P - (long)this->TextBegin >> 3);
    if (((uint)pCVar1 < this->TextSize - 1) &&
       (pCVar1 = (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)this->P,
       (pCVar1->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader !=
       (_func_int **)0x0)) {
      parseCurrentNode(this);
      this_local._7_1_ = 1;
      pCVar1 = extraout_RAX;
      goto LAB_00b933e9;
    }
  }
  this_local._7_1_ = 0;
LAB_00b933e9:
  return CONCAT71((int7)((ulong)pCVar1 >> 8),this_local._7_1_);
}

Assistant:

virtual bool read()
	{
		// if not end reached, parse the node
		if (P && (unsigned int)(P - TextBegin) < TextSize - 1 && *P != 0)
		{
			parseCurrentNode();
			return true;
		}

		_IRR_IMPLEMENT_MANAGED_MARSHALLING_BUGFIX;
		return false;
	}